

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

void __thiscall duckdb::TransactionInfo::Serialize(TransactionInfo *this,Serializer *serializer)

{
  ParseInfo::Serialize(&this->super_ParseInfo,serializer);
  Serializer::WriteProperty<duckdb::TransactionType>
            (serializer,200,"type",&(this->super_ParseInfo).field_0x9);
  Serializer::WriteProperty<duckdb::TransactionModifierType>
            (serializer,0xc9,"modifier",&(this->super_ParseInfo).field_0xa);
  return;
}

Assistant:

void TransactionInfo::Serialize(Serializer &serializer) const {
	ParseInfo::Serialize(serializer);
	serializer.WriteProperty<TransactionType>(200, "type", type);
	serializer.WriteProperty<TransactionModifierType>(201, "modifier", modifier);
}